

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::render_hline
          (rasterizer_cells_aa<agg::cell_aa> *this,int ey,int x1,int y1,int x2,int y2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  
  iVar14 = x2 >> 8;
  iVar6 = y2 - y1;
  if (iVar6 != 0) {
    iVar13 = x1 >> 8;
    uVar9 = x1 & 0xff;
    if (iVar13 == iVar14) {
      iVar14 = ((x2 & 0xffU) + uVar9) * iVar6;
      uVar3._0_4_ = (this->m_curr_cell).cover;
      uVar3._4_4_ = (this->m_curr_cell).area;
    }
    else {
      lVar18 = (long)x2 - (long)x1;
      if (lVar18 < 0) {
        lVar18 = -lVar18;
        iVar17 = -1;
        uVar15 = 0;
        uVar10 = uVar9;
      }
      else {
        uVar15 = 0x100;
        iVar17 = 1;
        uVar10 = 0x100 - uVar9;
      }
      lVar11 = (long)(int)(uVar10 * iVar6) % lVar18;
      iVar19 = (int)(lVar11 >> 0x3f) + (int)((long)(int)(uVar10 * iVar6) / lVar18);
      uVar1 = (this->m_curr_cell).cover;
      uVar4 = (this->m_curr_cell).area;
      (this->m_curr_cell).cover = iVar19 + uVar1;
      (this->m_curr_cell).area = (uVar9 | uVar15) * iVar19 + uVar4;
      set_curr_cell(this,iVar17 + iVar13,ey);
      iVar6 = y1 + iVar19;
      if (iVar17 + iVar13 != iVar14) {
        lVar8 = (long)(((iVar19 + y2) - iVar6) * 0x100);
        lVar12 = lVar8 % lVar18;
        uVar10 = (uint)(lVar12 >> 0x3f);
        uVar16 = (uint)lVar18;
        uVar9 = uVar16;
        if (lVar11 < 0) {
          uVar9 = 0;
        }
        iVar19 = (int)lVar11 - uVar9;
        for (; iVar14 - iVar17 != iVar13; iVar13 = iVar13 + iVar17) {
          iVar19 = iVar19 + (int)lVar12 + (uVar10 & uVar16);
          uVar9 = uVar16;
          if (-1 >= iVar19) {
            uVar9 = 0;
          }
          iVar7 = (uint)(-1 < iVar19) + (int)(lVar8 / lVar18) + uVar10;
          iVar19 = iVar19 - uVar9;
          iVar6 = iVar6 + iVar7;
          uVar2 = (this->m_curr_cell).cover;
          uVar5 = (this->m_curr_cell).area;
          (this->m_curr_cell).cover = iVar7 + uVar2;
          (this->m_curr_cell).area = iVar7 * 0x100 + uVar5;
          set_curr_cell(this,iVar17 * 2 + iVar13,ey);
        }
      }
      iVar6 = y2 - iVar6;
      iVar14 = ((x2 & 0xffU | 0x100) - uVar15) * iVar6;
      uVar3._0_4_ = (this->m_curr_cell).cover;
      uVar3._4_4_ = (this->m_curr_cell).area;
    }
    (this->m_curr_cell).cover = iVar6 + (int)uVar3;
    (this->m_curr_cell).area = iVar14 + (int)((ulong)uVar3 >> 0x20);
    return;
  }
  set_curr_cell(this,iVar14,ey);
  return;
}

Assistant:

AGG_INLINE void rasterizer_cells_aa<Cell>::render_hline(int ey, 
                                                            int x1, int y1, 
                                                            int x2, int y2)
    {
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int fx1 = x1 & poly_subpixel_mask;
        int fx2 = x2 & poly_subpixel_mask;

        int delta, p, first;
        long long dx;
        int incr, lift, mod, rem;

        //trivial case. Happens often
        if(y1 == y2)
        {
            set_curr_cell(ex2, ey);
            return;
        }

        //everything is located in a single cell.  That is easy!
        if(ex1 == ex2)
        {
            delta = y2 - y1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += (fx1 + fx2) * delta;
            return;
        }

        //ok, we'll have to render a run of adjacent cells on the same
        //hline...
        p     = (poly_subpixel_scale - fx1) * (y2 - y1);
        first = poly_subpixel_scale;
        incr  = 1;

        dx = (long long)x2 - (long long)x1;

        if(dx < 0)
        {
            p     = fx1 * (y2 - y1);
            first = 0;
            incr  = -1;
            dx    = -dx;
        }

        delta = (int)(p / dx);
        mod   = (int)(p % dx);

        if(mod < 0)
        {
            delta--;
            mod += dx;
        }

        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx1 + first) * delta;

        ex1 += incr;
        set_curr_cell(ex1, ey);
        y1  += delta;

        if(ex1 != ex2)
        {
            p     = poly_subpixel_scale * (y2 - y1 + delta);
            lift  = (int)(p / dx);
            rem   = (int)(p % dx);

            if (rem < 0)
            {
                lift--;
                rem += dx;
            }

            mod -= dx;

            while (ex1 != ex2)
            {
                delta = lift;
                mod  += rem;
                if(mod >= 0)
                {
                    mod -= dx;
                    delta++;
                }

                m_curr_cell.cover += delta;
                m_curr_cell.area  += poly_subpixel_scale * delta;
                y1  += delta;
                ex1 += incr;
                set_curr_cell(ex1, ey);
            }
        }
        delta = y2 - y1;
        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx2 + poly_subpixel_scale - first) * delta;
    }